

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

string * __thiscall
kratos::InterfaceVar::to_string_abi_cxx11_(string *__return_storage_ptr__,InterfaceVar *this)

{
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  basic_string_view<char> bVar1;
  string_view format_str;
  format_args args;
  undefined8 local_78;
  pointer pcStack_70;
  undefined8 local_68;
  undefined8 uStack_58;
  string parent_name;
  
  std::__cxx11::string::string((string *)&uStack_58,(string *)&this->interface_->name_);
  std::__cxx11::string::string
            ((string *)(parent_name.field_2._M_local_buf + 8),(string *)&(this->super_Var).name);
  local_78 = uStack_58;
  pcStack_70 = parent_name._M_dataplus._M_p;
  local_68 = parent_name.field_2._8_8_;
  bVar1 = fmt::v7::to_string_view<char,_0>("{0}.{1}");
  format_str.data_ = (char *)bVar1.size_;
  format_str.size_ = 0xdd;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_78;
  fmt::v7::detail::vformat_abi_cxx11_(__return_storage_ptr__,(detail *)bVar1.data_,format_str,args);
  std::__cxx11::string::~string((string *)(parent_name.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&uStack_58);
  return __return_storage_ptr__;
}

Assistant:

std::string InterfaceVar::to_string() const {
    std::string parent_name = interface_->name();
    return ::format("{0}.{1}", parent_name, Var::to_string());
}